

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineinput.cpp
# Opt level: O2

void CLineInput::RenderCandidates(void)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  ITextRender *pIVar4;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  uint uVar8;
  uint uVar9;
  long in_FS_OFFSET;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  CTextBoundingBox CVar14;
  float local_9c;
  char aBuf [8];
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = (*(s_pInput->super_IInterface)._vptr_IInterface[0x12])();
  if (((char)iVar6 != '\0') &&
     (iVar6 = (*(s_pInput->super_IInterface)._vptr_IInterface[0x17])(), iVar6 != 0)) {
    uVar1 = s_pGraphics->m_ScreenWidth;
    uVar2 = s_pGraphics->m_ScreenHeight;
    fVar12 = (float)(int)uVar2;
    fVar13 = ((float)(int)uVar1 / fVar12) * 300.0;
    local_9c = 0.0;
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[5])(0,0);
    if ((RenderCandidates()::s_CandidateCursor == '\0') &&
       (iVar6 = __cxa_guard_acquire(&RenderCandidates()::s_CandidateCursor), iVar6 != 0)) {
      CTextCursor::CTextCursor(&RenderCandidates::s_CandidateCursor);
      __cxa_atexit(CTextCursor::~CTextCursor,&RenderCandidates::s_CandidateCursor,&__dso_handle);
      __cxa_guard_release(&RenderCandidates()::s_CandidateCursor);
    }
    CTextCursor::Reset(&RenderCandidates::s_CandidateCursor,-1);
    aVar5 = s_CompositionWindowPosition.field_1;
    RenderCandidates::s_CandidateCursor.m_FontSize = 7.0;
    RenderCandidates::s_CandidateCursor.m_MaxLines = -1;
    RenderCandidates::s_CandidateCursor.m_LineSpacing = 2.45;
    fVar10 = (s_CompositionWindowPosition.field_0.x / (float)(int)uVar1) * fVar13;
    uVar8 = 1;
    uVar9 = 0;
    while( true ) {
      iVar6 = (*(s_pInput->super_IInterface)._vptr_IInterface[0x17])();
      if (iVar6 <= (int)uVar9) break;
      uVar7 = (*(s_pInput->super_IInterface)._vptr_IInterface[0x18])();
      if (uVar9 == uVar7) {
        local_9c = RenderCandidates::s_CandidateCursor.m_Height;
      }
      if (uVar9 != 0) {
        (*(s_pTextRender->super_IInterface)._vptr_IInterface[8])
                  (s_pTextRender,&RenderCandidates::s_CandidateCursor);
      }
      str_format(aBuf,8,"%d. ",(ulong)((uVar8 / 10) * -10 + 1 + uVar9));
      (*(s_pTextRender->super_IInterface)._vptr_IInterface[4])
                (0x3f19999a,0x3f19999a,0x3f19999a,0x3f800000);
      (*(s_pTextRender->super_IInterface)._vptr_IInterface[7])
                (s_pTextRender,&RenderCandidates::s_CandidateCursor,aBuf,0xffffffff);
      (*(s_pTextRender->super_IInterface)._vptr_IInterface[4])
                (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
      pIVar4 = s_pTextRender;
      iVar6 = (*(s_pInput->super_IInterface)._vptr_IInterface[0x16])(s_pInput,(ulong)uVar9);
      (*(pIVar4->super_IInterface)._vptr_IInterface[7])
                (pIVar4,&RenderCandidates::s_CandidateCursor,CONCAT44(extraout_var,iVar6),0xffffffff
                );
      uVar8 = uVar8 + 1;
      uVar9 = uVar9 + 1;
    }
    fVar11 = (aVar5.y / fVar12) * 300.0;
    CVar14 = CTextCursor::BoundingBox(&RenderCandidates::s_CandidateCursor);
    if (300.0 < fVar11 + 94.5) {
      fVar11 = fVar11 - ((s_CompositionLineHeight / fVar12) * 300.0 + CVar14.h + 4.0);
    }
    fVar12 = CVar14.w + 8.0 + fVar10 + 8.0;
    if (fVar13 < fVar12) {
      fVar10 = fVar10 - (fVar12 - fVar13);
    }
    RenderCandidates::s_CandidateCursor.m_CursorPos.field_1.y = fVar11 + 2.0;
    RenderCandidates::s_CandidateCursor.m_CursorPos.field_0.x = fVar10 + 4.0;
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x13])(s_pGraphics,0xffffffff);
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[8])();
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])(0,0,0,0x3f4ccccd);
    aBuf._0_4_ = fVar10 + 0.75;
    aBuf._4_4_ = fVar11 + 0.75;
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,aBuf,1);
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])
              (0x3e19999a,0x3e19999a,0x3e19999a,0x3f800000);
    aBuf._0_4_ = fVar10;
    aBuf._4_4_ = fVar11;
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,aBuf,1);
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])
              (0x3dcccccd,0x3ecccccd,0x3f4ccccd,0x3f800000);
    aBuf._0_4_ = fVar10 + 2.0;
    aBuf._4_4_ = local_9c + fVar11 + 2.0;
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,aBuf,1);
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
    (*(s_pTextRender->super_IInterface)._vptr_IInterface[0x10])
              (0x3f800000,s_pTextRender,&RenderCandidates::s_CandidateCursor,0,0xffffffff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CLineInput::RenderCandidates()
{
	if(!s_pInput->HasComposition() || !s_pInput->GetCandidateCount())
		return;

	const float FontSize = 7.0f;
	const float HMargin = 8.0f;
	const float VMargin = 4.0f;
	const float Height = 300;
	const float Width = Height*s_pGraphics->ScreenAspect();
	const int ScreenWidth = s_pGraphics->ScreenWidth();
	const int ScreenHeight = s_pGraphics->ScreenHeight();

	s_pGraphics->MapScreen(0, 0, Width, Height);

	static CTextCursor s_CandidateCursor;
	s_CandidateCursor.Reset();
	s_CandidateCursor.m_FontSize = FontSize;
	s_CandidateCursor.m_LineSpacing = FontSize*0.35f;
	s_CandidateCursor.m_MaxLines = -1;

	vec2 Position = s_CompositionWindowPosition / vec2(ScreenWidth, ScreenHeight) * vec2(Width, Height);
	float SelectedCandidateY = 0;
	for(int i = 0; i < s_pInput->GetCandidateCount(); ++i)
	{
		if(i == s_pInput->GetCandidateSelectedIndex())
			SelectedCandidateY = s_CandidateCursor.Height();

		if(i > 0)
			s_pTextRender->TextNewline(&s_CandidateCursor);

		char aBuf[8];
		str_format(aBuf, sizeof(aBuf), "%d. ", (i+1)%10);

		s_pTextRender->TextColor(0.6f, 0.6f, 0.6f, 1.0f);
		s_pTextRender->TextDeferred(&s_CandidateCursor, aBuf, -1);
		s_pTextRender->TextColor(1.0f, 1.0f, 1.0f, 1.0f);
		s_pTextRender->TextDeferred(&s_CandidateCursor, s_pInput->GetCandidate(i), -1);
	}

	CTextBoundingBox BoundingBox = s_CandidateCursor.BoundingBox();
	BoundingBox.x = Position.x;
	BoundingBox.y = Position.y;
	BoundingBox.w += HMargin;
	BoundingBox.h += VMargin;

	// move candidate window up if needed
	if(BoundingBox.y + FontSize * 13.5f > Height)
		BoundingBox.y -= BoundingBox.h + s_CompositionLineHeight / ScreenHeight * Height;

	// move candidate window left if needed
	if(BoundingBox.x + BoundingBox.w + HMargin > Width)
		BoundingBox.x -= BoundingBox.x + BoundingBox.w + HMargin - Width;

	s_CandidateCursor.MoveTo(vec2(BoundingBox.x+HMargin/2, BoundingBox.y+VMargin/2));

	s_pGraphics->TextureClear();
	s_pGraphics->QuadsBegin();
	s_pGraphics->BlendNormal();

	// window shadow
	s_pGraphics->SetColor(0.0f, 0.0f, 0.0f, 0.8f);
	IGraphics::CQuadItem Quad = IGraphics::CQuadItem(BoundingBox.x+0.75f, BoundingBox.y+0.75f, BoundingBox.w, BoundingBox.h);
	s_pGraphics->QuadsDrawTL(&Quad, 1);

	// window background
	s_pGraphics->SetColor(0.15f, 0.15f, 0.15f, 1.0f);
	Quad = IGraphics::CQuadItem(BoundingBox.x, BoundingBox.y, BoundingBox.w, BoundingBox.h);
	s_pGraphics->QuadsDrawTL(&Quad, 1);

	// highlight
	s_pGraphics->SetColor(0.1f, 0.4f, 0.8f, 1.0f);
	Quad = IGraphics::CQuadItem(BoundingBox.x+HMargin/4, BoundingBox.y+VMargin/2+SelectedCandidateY, BoundingBox.w-HMargin/2, FontSize*1.35f);
	s_pGraphics->QuadsDrawTL(&Quad, 1);
	s_pGraphics->QuadsEnd();

	s_pTextRender->DrawTextOutlined(&s_CandidateCursor);
}